

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_dialog_box.cpp
# Opt level: O0

Am_Object create_script_for(Am_Value_List *commands_for_script,Am_Input_Char accel_char,
                           Am_String *name,bool on_new,Am_Object *window,Am_Object *selection_widget
                           )

{
  Am_Slot_Key AVar1;
  bool bVar2;
  Am_Object *pAVar3;
  Am_Wrapper *pAVar4;
  Am_Value *pAVar5;
  ostream *poVar6;
  void *pvVar7;
  undefined7 in_register_00000009;
  undefined4 in_register_00000034;
  Am_Value_List *this;
  Am_Object *in_stack_00000008;
  Am_Object local_e8;
  Am_Object local_e0;
  Am_Object local_d8;
  int local_d0;
  int local_cc;
  int command_index;
  int cnt;
  Am_Object placeholder;
  Am_Value created_objects;
  Am_Value_List created_objects_assoc;
  Am_Value_List placeholder_list;
  Am_Value_List new_cmd_list;
  Am_Value_List original_command_list;
  Am_Object local_60;
  byte local_55;
  Am_Object local_48;
  Am_Object new_cmd;
  Am_Object cmd;
  Am_Object *window_local;
  bool on_new_local;
  Am_String *name_local;
  Am_Value_List *commands_for_script_local;
  Am_Input_Char accel_char_local;
  Am_Object *execute_script_command;
  
  this = (Am_Value_List *)CONCAT44(in_register_00000034,accel_char);
  Am_Object::Am_Object(&new_cmd);
  Am_Object::Am_Object(&local_48);
  local_55 = 0;
  Am_Object::Create(&local_60,(char *)&Am_Execute_Script_Command);
  pAVar3 = Am_Object::Set(&local_60,0x150,(Am_String *)CONCAT71(in_register_00000009,on_new),0);
  Am_Input_Char::operator_cast_to_Am_Value((Am_Input_Char *)&original_command_list.item);
  pAVar3 = Am_Object::Set(pAVar3,0x152,(Am_Value *)&original_command_list.item,0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(selection_widget);
  pAVar3 = Am_Object::Add(pAVar3,0x68,pAVar4,0);
  pAVar3 = Am_Object::Add(pAVar3,Am_EXECUTE_SCRIPT_ON_NEW,(bool)((byte)window & 1),0);
  pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(in_stack_00000008);
  pAVar3 = Am_Object::Add(pAVar3,0x197,pAVar4,0);
  Am_Object::Am_Object((Am_Object *)commands_for_script,pAVar3);
  Am_Value::~Am_Value((Am_Value *)&original_command_list.item);
  Am_Object::~Am_Object(&local_60);
  Am_Value_List::Am_Value_List((Am_Value_List *)&new_cmd_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&placeholder_list.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&created_objects_assoc.item);
  Am_Value_List::Am_Value_List((Am_Value_List *)&created_objects.value);
  Am_Value::Am_Value((Am_Value *)&placeholder);
  Am_Object::Am_Object((Am_Object *)&command_index);
  local_cc = 0;
  local_d0 = 1;
  Am_Value_List::End(this);
  while (bVar2 = Am_Value_List::First(this), AVar1 = Am_COMMANDS_PROTOTYPES,
        ((bVar2 ^ 0xffU) & 1) != 0) {
    pAVar5 = Am_Value_List::Get(this);
    Am_Object::operator=(&new_cmd,pAVar5);
    if ((am_sdebug & 1U) != 0) {
      poVar6 = std::operator<<((ostream *)&std::cout,"\nprocessing command ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_d0);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = operator<<(poVar6,&new_cmd);
      pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
    }
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&new_cmd);
    Am_Value_List::Add((Am_Value_List *)&new_cmd_list.item,pAVar4,Am_TAIL,true);
    Am_Object::Copy_Value_Only(&local_d8,(char *)&new_cmd);
    Am_Object::operator=(&local_48,&local_d8);
    Am_Object::~Am_Object(&local_d8);
    Am_Object::Set(&local_48,Am_COMMAND_INDEX_IN_SCRIPT,local_d0,1);
    Am_Object::Am_Object(&local_e0,&Am_Object_Create_Command);
    bVar2 = Am_Object::Is_Instance_Of(&local_48,&local_e0);
    Am_Object::~Am_Object(&local_e0);
    if (bVar2) {
      am_check_start_obj_parameters
                (&local_48,(Am_Value_List *)&created_objects_assoc.item,
                 (Am_Value_List *)&created_objects.value,&local_cc);
    }
    else {
      am_check_obj_modified
                (&local_48,(Am_Value_List *)&created_objects_assoc.item,
                 (Am_Value_List *)&created_objects.value,&local_cc);
    }
    Am_Object::Am_Object(&local_e8,&Am_Defines_A_Collection_Command);
    bVar2 = Am_Object::Is_Instance_Of(&local_48,&local_e8);
    Am_Object::~Am_Object(&local_e8);
    if (bVar2) {
      pAVar5 = Am_Object::Get(&local_48,0x169,0);
      Am_Value::operator=((Am_Value *)&placeholder,pAVar5);
      am_note_created_objects
                (&local_48,(Am_Value *)&placeholder,(Am_Value_List *)&created_objects.value);
    }
    Am_Object::Set(&local_48,0x154,-10,0);
    pAVar4 = Am_Object::operator_cast_to_Am_Wrapper_(&local_48);
    Am_Value_List::Add((Am_Value_List *)&placeholder_list.item,pAVar4,Am_TAIL,true);
    Am_Value_List::Prev(this);
    local_d0 = local_d0 + 1;
  }
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&placeholder_list.item);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  AVar1 = Am_COMMANDS_IN_SCRIPT;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&placeholder_list.item);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  AVar1 = Am_ORIGINAL_COMMAND_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&new_cmd_list.item);
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  AVar1 = Am_PLACEHOLDER_LIST;
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_((Am_Value_List *)&created_objects_assoc.item)
  ;
  Am_Object::Set((Am_Object *)commands_for_script,AVar1,pAVar4,0);
  Am_Object::Set((Am_Object *)commands_for_script,Am_PLACEHOLDER_COUNT,local_cc,0);
  if ((am_sdebug & 1U) != 0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"%% Execute command ");
    poVar6 = operator<<(poVar6,(Am_Object *)commands_for_script);
    poVar6 = std::operator<<(poVar6," orig ");
    poVar6 = operator<<(poVar6,(Am_Value_List *)&new_cmd_list.item);
    poVar6 = std::operator<<(poVar6," new ");
    poVar6 = operator<<(poVar6,(Am_Value_List *)&placeholder_list.item);
    pvVar7 = (void *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar7,std::flush<char,std::char_traits<char>>);
  }
  local_55 = 1;
  Am_Object::~Am_Object((Am_Object *)&command_index);
  Am_Value::~Am_Value((Am_Value *)&placeholder);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&created_objects.value);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&created_objects_assoc.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&placeholder_list.item);
  Am_Value_List::~Am_Value_List((Am_Value_List *)&new_cmd_list.item);
  if ((local_55 & 1) == 0) {
    Am_Object::~Am_Object((Am_Object *)commands_for_script);
  }
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&new_cmd);
  return (Am_Object)(Am_Object_Data *)commands_for_script;
}

Assistant:

Am_Object
create_script_for(Am_Value_List &commands_for_script, Am_Input_Char accel_char,
                  Am_String &name, bool on_new, Am_Object &window,
                  Am_Object &selection_widget)
{
  Am_Object cmd, new_cmd;
  Am_Object execute_script_command =
      Am_Execute_Script_Command.Create()
          .Set(Am_LABEL, name)
          .Set(Am_ACCELERATOR, accel_char)
          .Add(Am_WINDOW, window)
          .Add(Am_EXECUTE_SCRIPT_ON_NEW, on_new)
          .Add(Am_SELECTION_WIDGET, selection_widget);
  Am_Value_List original_command_list, new_cmd_list, placeholder_list,
      created_objects_assoc;
  Am_Value created_objects;
  Am_Object placeholder;
  int cnt = 0;
  int command_index = 1;
  //commands come in backwards, swap them
  for (commands_for_script.End(); !commands_for_script.First();
       commands_for_script.Prev(), command_index++) {
    cmd = commands_for_script.Get();
    if (am_sdebug)
      std::cout << "\nprocessing command " << command_index << ": " << cmd
                << std::endl
                << std::flush;
    original_command_list.Add(cmd);
    new_cmd = cmd.Copy_Value_Only();
    new_cmd.Set(Am_COMMAND_INDEX_IN_SCRIPT, command_index, Am_OK_IF_NOT_THERE);
    //if not creating from scratch, then check the parameters
    //group_command is both a from_create AND it needs its parameters munged
    if (new_cmd.Is_Instance_Of(Am_Object_Create_Command))
      am_check_start_obj_parameters(new_cmd, placeholder_list,
                                    created_objects_assoc, cnt);
    else
      am_check_obj_modified(new_cmd, placeholder_list, created_objects_assoc,
                            cnt);
    //be sure to note created objects AFTER dealing with the parameters of
    //this command, so this command won't refer to itself
    if (new_cmd.Is_Instance_Of(Am_Defines_A_Collection_Command)) {
      created_objects = new_cmd.Get(Am_VALUE);
      am_note_created_objects(new_cmd, created_objects, created_objects_assoc);
    }

    new_cmd.Set(Am_IMPLEMENTATION_PARENT, Am_IN_A_SCRIPT);
    new_cmd_list.Add(new_cmd);
  }
  //when script is executed, the Am_COMMANDS_IN_SCRIPT gets the new cmds,
  //which can be undone, but the Am_COMMANDS_PROTOTYPES stay the same
  execute_script_command.Set(Am_COMMANDS_PROTOTYPES, new_cmd_list);
  execute_script_command.Set(Am_COMMANDS_IN_SCRIPT, new_cmd_list);
  execute_script_command.Set(Am_ORIGINAL_COMMAND_LIST, original_command_list);
  execute_script_command.Set(Am_PLACEHOLDER_LIST, placeholder_list);
  execute_script_command.Set(Am_PLACEHOLDER_COUNT, cnt);

  if (am_sdebug)
    std::cout << "%% Execute command " << execute_script_command << " orig "
              << original_command_list << " new " << new_cmd_list << std::endl
              << std::flush;
  return execute_script_command;
}